

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O1

CURLcode Curl_build_unencoding_stack(Curl_easy *data,char *enclist,int maybechunked)

{
  undefined1 *puVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  CURLcode CVar5;
  size_t sVar6;
  contenc_writer *pcVar7;
  contenc_writer *pcVar8;
  content_encoding **ppcVar9;
  byte *pbVar10;
  content_encoding *ce;
  content_encoding *pcVar11;
  size_t max;
  CURLcode local_4c;
  ulong local_48;
  content_encoding *local_40;
  
  local_48 = 0;
LAB_00601d88:
  while (((ulong)(byte)*enclist < 0x2d &&
         ((0x100100000200U >> ((ulong)(byte)*enclist & 0x3f) & 1) != 0))) {
    enclist = (char *)((byte *)enclist + 1);
  }
  sVar6 = 1;
  max = 0;
  pbVar10 = (byte *)enclist;
  do {
    bVar2 = *pbVar10;
    if (bVar2 < 0x20) {
      if (bVar2 != 9) {
        if (bVar2 != 0) goto LAB_00601dca;
        break;
      }
    }
    else if (bVar2 != 0x20) {
      if (bVar2 == 0x2c) break;
LAB_00601dca:
      if (3 < (byte)(bVar2 - 10)) {
        max = sVar6;
      }
    }
    pbVar10 = pbVar10 + 1;
    sVar6 = sVar6 + 1;
  } while( true );
  if ((max == 7 && maybechunked != 0) &&
     (iVar4 = Curl_strncasecompare(enclist,"chunked",7), iVar4 != 0)) {
    puVar1 = &(data->req).field_0xd9;
    *puVar1 = *puVar1 | 0x20;
    Curl_httpchunk_init(data);
LAB_00601f86:
    bVar3 = true;
  }
  else {
    bVar3 = true;
    if (max == 0) goto LAB_00601f9c;
    ppcVar9 = encodings;
    pcVar11 = &identity_encoding;
    do {
      ppcVar9 = ppcVar9 + 1;
      iVar4 = Curl_strncasecompare(enclist,pcVar11->name,max);
      if (((iVar4 == 0) || (pcVar11->name[max] != '\0')) &&
         ((pcVar11->alias == (char *)0x0 ||
          ((iVar4 = Curl_strncasecompare(enclist,pcVar11->alias,max), iVar4 == 0 ||
           (pcVar11->alias[max] != '\0')))))) {
        bVar3 = true;
      }
      else {
        bVar3 = false;
        local_40 = pcVar11;
      }
      pcVar11 = local_40;
      if (!bVar3) goto LAB_00601e9a;
      pcVar11 = *ppcVar9;
    } while (pcVar11 != (content_encoding *)0x0);
    pcVar11 = (content_encoding *)0x0;
LAB_00601e9a:
    if ((data->req).writer_stack == (contenc_writer *)0x0) {
      pcVar7 = (contenc_writer *)(*Curl_ccalloc)(1,0x10);
      if (pcVar7 == (contenc_writer *)0x0) {
        pcVar7 = (contenc_writer *)0x0;
      }
      else {
        pcVar7->handler = &client_encoding;
        pcVar7->downstream = (contenc_writer *)0x0;
      }
      (data->req).writer_stack = pcVar7;
      if (pcVar7 != (contenc_writer *)0x0) goto LAB_00601eec;
      local_4c = CURLE_OUT_OF_MEMORY;
    }
    else {
LAB_00601eec:
      iVar4 = (int)local_48;
      local_48 = (ulong)(iVar4 + 1);
      if (iVar4 < 4) {
        if (pcVar11 == (content_encoding *)0x0) {
          pcVar11 = &error_encoding;
        }
        pcVar7 = (data->req).writer_stack;
        pcVar8 = (contenc_writer *)(*Curl_ccalloc)(1,pcVar11->writersize);
        if (pcVar8 == (contenc_writer *)0x0) {
LAB_00601f6a:
          pcVar8 = (contenc_writer *)0x0;
        }
        else {
          pcVar8->handler = pcVar11;
          pcVar8->downstream = pcVar7;
          CVar5 = (*pcVar11->init_writer)(data,pcVar8);
          if (CVar5 != CURLE_OK) {
            (*Curl_cfree)(pcVar8);
            goto LAB_00601f6a;
          }
        }
        if (pcVar8 != (contenc_writer *)0x0) {
          (data->req).writer_stack = pcVar8;
          goto LAB_00601f86;
        }
        local_4c = CURLE_OUT_OF_MEMORY;
      }
      else {
        Curl_failf(data,"Reject response due to %u content encodings",local_48);
        local_4c = CURLE_BAD_CONTENT_ENCODING;
      }
    }
    bVar3 = false;
  }
LAB_00601f9c:
  if (!bVar3) {
    return local_4c;
  }
  enclist = (char *)pbVar10;
  if (*pbVar10 == 0) {
    return CURLE_OK;
  }
  goto LAB_00601d88;
}

Assistant:

CURLcode Curl_build_unencoding_stack(struct Curl_easy *data,
                                     const char *enclist, int maybechunked)
{
  struct SingleRequest *k = &data->req;
  int counter = 0;

  do {
    const char *name;
    size_t namelen;

    /* Parse a single encoding name. */
    while(ISBLANK(*enclist) || *enclist == ',')
      enclist++;

    name = enclist;

    for(namelen = 0; *enclist && *enclist != ','; enclist++)
      if(!ISSPACE(*enclist))
        namelen = enclist - name + 1;

    /* Special case: chunked encoding is handled at the reader level. */
    if(maybechunked && namelen == 7 && strncasecompare(name, "chunked", 7)) {
      k->chunk = TRUE;             /* chunks coming our way. */
      Curl_httpchunk_init(data);   /* init our chunky engine. */
    }
    else if(namelen) {
      const struct content_encoding *encoding = find_encoding(name, namelen);
      struct contenc_writer *writer;

      if(!k->writer_stack) {
        k->writer_stack = new_unencoding_writer(data, &client_encoding, NULL);

        if(!k->writer_stack)
          return CURLE_OUT_OF_MEMORY;
      }

      if(!encoding)
        encoding = &error_encoding;  /* Defer error at stack use. */

      if(++counter >= MAX_ENCODE_STACK) {
        failf(data, "Reject response due to %u content encodings",
              counter);
        return CURLE_BAD_CONTENT_ENCODING;
      }
      /* Stack the unencoding stage. */
      writer = new_unencoding_writer(data, encoding, k->writer_stack);
      if(!writer)
        return CURLE_OUT_OF_MEMORY;
      k->writer_stack = writer;
    }
  } while(*enclist);

  return CURLE_OK;
}